

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedWithCleanupFallback
          (SerialArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  CleanupNode *pCVar2;
  CleanupNode *pCVar3;
  char *pcVar4;
  string *psVar5;
  __pointer_type pAVar6;
  void *pvVar7;
  CleanupNode *pCVar8;
  __pointer_type pAVar9;
  CleanupNode *pCVar10;
  undefined8 uVar11;
  size_t n_00;
  ulong n_01;
  size_type sStack_50;
  __base_type local_40 [2];
  
  if (align < 9) {
    n_00 = n + 7 & 0xfffffffffffffff8;
    n_01 = n_00;
  }
  else {
    local_40[0]._M_p = (__pointer_type)ArenaAlignAs(align);
    n_00 = ArenaAlign::Padded((ArenaAlign *)local_40,n);
    n_01 = n + 7 & 0xfffffffffffffff8;
  }
  AllocateNewBlock(this,n_00);
  local_40[0]._M_p = (__pointer_type)ArenaAlignAs(align);
  pcVar4 = ArenaAlign::CeilDefaultAligned<char>((ArenaAlign *)local_40,(this->ptr_)._M_b._M_p);
  pAVar1 = (__pointer_type)(pcVar4 + n_01);
  if ((__pointer_type)this->limit_ < pAVar1) {
    pvVar7 = AllocateAlignedWithCleanupFallback(this,n_01,align,destructor);
    return pvVar7;
  }
  (this->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar2 = (this->cleanup_list_).next_;
  if (pCVar2 < (this->cleanup_list_).limit_) {
    (this->cleanup_list_).next_ = pCVar2 + 1;
    pCVar2->elem = pcVar4;
    pCVar2->destructor = destructor;
  }
  else {
    cleanup::ChunkList::AddFallback(&this->cleanup_list_,pcVar4,destructor,this);
  }
  pCVar2 = (CleanupNode *)(this->cleanup_list_).prefetch_ptr_;
  if ((pCVar2 != (CleanupNode *)0x0) && (pCVar2 < (CleanupNode *)(this->cleanup_list_).head_)) {
    pcVar4 = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    sStack_50 = 0x90;
    uVar11 = 0x137;
    goto LAB_001a53f9;
  }
  pCVar3 = (this->cleanup_list_).next_;
  pCVar8 = pCVar2;
  if (((long)pCVar2 - (long)pCVar3 < 0x181) &&
     (pCVar10 = (this->cleanup_list_).limit_, pCVar2 < pCVar10)) {
    pCVar8 = pCVar3;
    if (pCVar3 < pCVar2) {
      pCVar8 = pCVar2;
    }
    if (pCVar8 != (CleanupNode *)0x0) {
      if (pCVar8 + 0x18 < pCVar10) {
        pCVar10 = pCVar8 + 0x18;
      }
      for (; pCVar8 < pCVar10; pCVar8 = pCVar8 + 4) {
      }
      goto LAB_001a52a1;
    }
  }
  else {
LAB_001a52a1:
    (this->cleanup_list_).prefetch_ptr_ = (char *)pCVar8;
    local_40[0]._M_p = (this->ptr_)._M_b._M_p;
    psVar5 = absl::lts_20240722::log_internal::Check_GEImpl<char*,char*>
                       (&this->limit_,&local_40[0]._M_p,"limit_ >= ptr()");
    if (psVar5 != (string *)0x0) {
      pcVar4 = (psVar5->_M_dataplus)._M_p;
      sStack_50 = psVar5->_M_string_length;
      uVar11 = 0xf3;
      goto LAB_001a53f9;
    }
    pAVar6 = (__pointer_type)this->prefetch_ptr_;
    if ((pAVar6 != (__pointer_type)0x0) && (pAVar6 < (this->head_)._M_b._M_p)) {
      pcVar4 = 
      "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
      ;
      sStack_50 = 0x67;
      uVar11 = 0x12e;
      goto LAB_001a53f9;
    }
    if ((0x400 < (long)pAVar6 - (long)pAVar1) ||
       (pAVar9 = (__pointer_type)this->limit_, pAVar9 <= pAVar6)) {
LAB_001a52f5:
      this->prefetch_ptr_ = (char *)pAVar6;
      return pcVar4;
    }
    if (pAVar1 < pAVar6) {
      pAVar1 = pAVar6;
    }
    pAVar6 = pAVar1;
    if (pAVar6 != (__pointer_type)0x0) {
      if (pAVar6 + 0x40 < pAVar9) {
        pAVar9 = pAVar6 + 0x40;
      }
      for (; pAVar6 < pAVar9; pAVar6 = pAVar6 + 4) {
      }
      goto LAB_001a52f5;
    }
  }
  pcVar4 = "prefetch_ptr != nullptr";
  sStack_50 = 0x17;
  uVar11 = 0x123;
LAB_001a53f9:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
             ,uVar11,sStack_50,pcVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_40);
}

Assistant:

PROTOBUF_NOINLINE
void* SerialArena::AllocateAlignedWithCleanupFallback(
    size_t n, size_t align, void (*destructor)(void*)) {
  size_t required = AlignUpTo(n, align);
  AllocateNewBlock(required);
  return AllocateAlignedWithCleanup(n, align, destructor);
}